

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_unittest_macro(gravity_parser_t *parser)

{
  long lVar1;
  gravity_lexer_t *parser_00;
  gtoken_t gVar2;
  int iVar3;
  gnode_identifier_expr_t *pgVar4;
  gravity_value_t gVar5;
  gravity_unittest_callback unittest_cb;
  gravity_class_t *local_908;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  int32_t expected_ncol;
  int32_t expected_nrow;
  gravity_value_t expected_value;
  char local_8d8 [4];
  error_type_t expected_error;
  char buffer2 [1024];
  char buffer [1024];
  char *local_d0;
  char *note;
  char *description;
  gtoken_t local_94;
  gtoken_t local_90;
  gtoken_t peek;
  gtoken_t op;
  unittest_t type;
  char *id;
  gnode_literal_expr_t *value_node;
  gnode_literal_expr_t *col_node;
  gnode_literal_expr_t *row_node;
  gnode_identifier_expr_t *err_node;
  gnode_literal_expr_t *note_node;
  gnode_literal_expr_t *name_node;
  gravity_lexer_t *local_28;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  local_28 = parser->lexer->p[parser->lexer->n - 1];
  lexer = (gravity_lexer_t *)parser;
  if (parser->statements->n == 2) {
    note_node = (gnode_literal_expr_t *)0x0;
    err_node = (gnode_identifier_expr_t *)0x0;
    row_node = (gnode_literal_expr_t *)0x0;
    col_node = (gnode_literal_expr_t *)0x0;
    value_node = (gnode_literal_expr_t *)0x0;
    id = (char *)0x0;
    parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
    while (gVar2 = gravity_lexer_peek(local_28), gVar2 != TOK_OP_CLOSED_CURLYBRACE) {
      _op = parse_identifier((gravity_parser_t *)lexer);
      if (_op == (char *)0x0) goto LAB_0012929d;
      parse_required((gravity_parser_t *)lexer,TOK_OP_COLON);
      peek = parse_unittest_identifier(_op);
      free(_op);
      parser_00 = lexer;
      if (peek == TOK_ERROR) {
        note_node = (gnode_literal_expr_t *)parse_literal_expression((gravity_parser_t *)lexer);
        pgVar4 = (gnode_identifier_expr_t *)note_node;
joined_r0x00128c39:
        if (pgVar4 == (gnode_identifier_expr_t *)0x0) {
LAB_0012929d:
          parse_skip_until((gravity_parser_t *)lexer,TOK_OP_CLOSED_CURLYBRACE);
          return (gnode_t *)0x0;
        }
      }
      else {
        if (peek == TOK_SPECIAL) {
          err_node = (gnode_identifier_expr_t *)parse_literal_expression((gravity_parser_t *)lexer);
          pgVar4 = err_node;
          goto joined_r0x00128c39;
        }
        if (peek == TOK_COMMENT) {
          row_node = (gnode_literal_expr_t *)parse_identifier_expression((gravity_parser_t *)lexer);
          pgVar4 = (gnode_identifier_expr_t *)row_node;
          goto joined_r0x00128c39;
        }
        if (peek == TOK_NUMBER) {
          col_node = (gnode_literal_expr_t *)parse_literal_expression((gravity_parser_t *)lexer);
          pgVar4 = (gnode_identifier_expr_t *)col_node;
          goto joined_r0x00128c39;
        }
        if (peek == TOK_IDENTIFIER) {
          value_node = (gnode_literal_expr_t *)parse_literal_expression((gravity_parser_t *)lexer);
          pgVar4 = (gnode_identifier_expr_t *)value_node;
          goto joined_r0x00128c39;
        }
        if (peek != TOK_STRING) {
          gravity_lexer_token((gtoken_s *)&description,local_28);
          report_error((gravity_parser_t *)parser_00,GRAVITY_ERROR_SYNTAX,0x175f4d);
          goto LAB_0012929d;
        }
        local_90 = TOK_EOF;
        local_94 = gravity_lexer_peek(local_28);
        if ((local_94 == TOK_OP_SUB) || (local_94 == TOK_OP_ADD)) {
          local_90 = gravity_lexer_next(local_28);
LAB_00128d24:
          id = (char *)parse_literal_expression((gravity_parser_t *)lexer);
          if ((gnode_t *)id == (gnode_t *)0x0) goto LAB_0012929d;
          if (local_90 == TOK_OP_SUB) {
            if (((gnode_t *)((long)id + 0x48))->tag == NODE_LABEL_STAT) {
              *(long *)&((gnode_t *)((long)id + 0x48))->block_length =
                   -*(long *)&((gnode_t *)((long)id + 0x48))->block_length;
            }
            else if (((gnode_t *)((long)id + 0x48))->tag == NODE_COMPOUND_STAT) {
              *(ulong *)&((gnode_t *)((long)id + 0x48))->block_length =
                   *(ulong *)&((gnode_t *)((long)id + 0x48))->block_length ^ 0x8000000000000000;
            }
          }
        }
        else {
          if (local_94 != TOK_KEY_NULL) goto LAB_00128d24;
          gravity_lexer_next(local_28);
          id = (char *)0x0;
        }
      }
      parse_semicolon((gravity_parser_t *)lexer);
    }
    parse_required((gravity_parser_t *)lexer,TOK_OP_CLOSED_CURLYBRACE);
    parse_semicolon((gravity_parser_t *)lexer);
    note = (char *)0x0;
    local_d0 = (char *)0x0;
    expected_value.field_1.n._4_4_ = 0;
    _expected_ncol = gravity_class_null;
    expected_value.isa = (gravity_class_t *)0x0;
    local_8f4 = 0xffffffff;
    local_8f8 = 0xffffffff;
    if ((note_node != (gnode_literal_expr_t *)0x0) && (note_node->type == LITERAL_STRING)) {
      snprintf(buffer2 + 0x3f8,0x400,"%.*s",(ulong)note_node->len,(note_node->value).str);
      note = buffer2 + 0x3f8;
    }
    if ((err_node != (gnode_identifier_expr_t *)0x0) && (*(int *)&err_node->value == 0)) {
      snprintf(local_8d8,0x400,"%.*s",(ulong)*(uint *)((long)&err_node->value + 4),err_node->value2)
      ;
      local_d0 = local_8d8;
    }
    if (row_node != (gnode_literal_expr_t *)0x0) {
      iVar3 = string_cmp(*(char **)&row_node->type,"NONE");
      if (iVar3 == 0) {
        expected_value.field_1.n._4_4_ = 0;
      }
      else {
        iVar3 = string_cmp(*(char **)&row_node->type,"SYNTAX");
        if (iVar3 == 0) {
          expected_value.field_1.n._4_4_ = 1;
        }
        else {
          iVar3 = string_cmp(*(char **)&row_node->type,"SEMANTIC");
          if (iVar3 == 0) {
            expected_value.field_1.n._4_4_ = 2;
          }
          else {
            iVar3 = string_cmp(*(char **)&row_node->type,"RUNTIME");
            if (iVar3 == 0) {
              expected_value.field_1.n._4_4_ = 3;
            }
            else {
              iVar3 = string_cmp(*(char **)&row_node->type,"WARNING");
              if (iVar3 == 0) {
                expected_value.field_1.n._4_4_ = 5;
              }
            }
          }
        }
      }
    }
    if ((col_node != (gnode_literal_expr_t *)0x0) && (col_node->type == LITERAL_INT)) {
      local_8f4 = (undefined4)(col_node->value).n64;
    }
    if ((value_node != (gnode_literal_expr_t *)0x0) && (value_node->type == LITERAL_INT)) {
      local_8f8 = (undefined4)(value_node->value).n64;
    }
    if (id != (char *)0x0) {
      if (*(int *)(id + 0x48) == 0) {
        gVar5 = gravity_string_to_value((gravity_vm *)0x0,*(char **)(id + 0x50),0xffffffff);
        local_908 = gVar5.isa;
        _expected_ncol = local_908;
        local_900 = gVar5.field_1;
        expected_value.isa = local_900.p;
      }
      else if (*(int *)(id + 0x48) == 2) {
        expected_value.isa = *(gravity_class_t **)(id + 0x50);
        _expected_ncol = gravity_class_int;
      }
      else if (*(int *)(id + 0x48) == 1) {
        expected_value.isa = *(gravity_class_t **)(id + 0x50);
        _expected_ncol = gravity_class_float;
      }
      else if (*(int *)(id + 0x48) == 3) {
        expected_value.isa = (gravity_class_t *)(ulong)(*(long *)(id + 0x50) != 0);
        _expected_ncol = gravity_class_bool;
      }
    }
    lVar1._0_4_ = lexer->colno;
    lVar1._4_4_ = lexer->fileid;
    if ((lVar1 == 0) || (*(long *)(*(long *)&lexer->colno + 0x28) == 0)) {
      gVar5.field_1.p = expected_value.isa;
      gVar5.isa = _expected_ncol;
      gravity_value_free((gravity_vm *)0x0,gVar5);
    }
    else {
      (**(code **)(*(long *)&lexer->colno + 0x28))
                (0,expected_value.field_1.n._4_4_,note,local_d0,_expected_ncol,expected_value.isa,
                 local_8f4,local_8f8,(int)**(undefined8 **)&lexer->colno);
    }
    if (note_node != (gnode_literal_expr_t *)0x0) {
      gnode_free(&note_node->base);
    }
    if (err_node != (gnode_identifier_expr_t *)0x0) {
      gnode_free(&err_node->base);
    }
    if (row_node != (gnode_literal_expr_t *)0x0) {
      gnode_free(&row_node->base);
    }
    if (col_node != (gnode_literal_expr_t *)0x0) {
      gnode_free(&col_node->base);
    }
    if (value_node != (gnode_literal_expr_t *)0x0) {
      gnode_free(&value_node->base);
    }
    if (id != (char *)0x0) {
      gnode_free((gnode_t *)id);
    }
  }
  else {
    gravity_lexer_token((gtoken_s *)&name_node,local_28);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x175ef4);
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_unittest_macro (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_unittest_macro");
    DECLARE_LEXER;

    // #unittest {
    //        name: "Unit test name";
    //        note: "Some notes here";
    //        error: NONE, SYNTAX, RUNTIME, WARNING;
    //        error_row: number;
    //        error_col: number;
    //        result: LITERAL;
    // '}' ';'?
    
    // sanity check: unittest macro must be root of the document
    // 1. parse_statement
    // 2. parse_macro_statement
    if (marray_size(*parser->statements) != 2) {
        REPORT_ERROR(gravity_lexer_token(lexer), "#unittest macro cannot be embedded in a statement (it must be the root of the document).");
        return NULL;
    }

    gnode_literal_expr_t *name_node = NULL;
    gnode_literal_expr_t *note_node = NULL;
    gnode_identifier_expr_t *err_node = NULL;
    gnode_literal_expr_t *row_node = NULL;
    gnode_literal_expr_t *col_node = NULL;
    gnode_literal_expr_t *value_node = NULL;

    parse_required(parser, TOK_OP_OPEN_CURLYBRACE);
    while (gravity_lexer_peek(lexer) != TOK_OP_CLOSED_CURLYBRACE) {
        const char *id = parse_identifier(parser);
        if (id == NULL) goto handle_error;
        parse_required(parser, TOK_OP_COLON);

        unittest_t type = parse_unittest_identifier(id);
        mem_free(id);

        if (type == UNITTEST_NAME) {
            name_node = (gnode_literal_expr_t *)parse_literal_expression(parser);
            if (name_node == NULL) goto handle_error;
        }
        else if (type == UNITTEST_NOTE) {
            note_node = (gnode_literal_expr_t *)parse_literal_expression(parser);
            if (note_node == NULL) goto handle_error;
        }
        else if (type == UNITTEST_ERROR) {
            err_node = (gnode_identifier_expr_t *)parse_identifier_expression(parser);
            if (err_node == NULL) goto handle_error;
        }
        else if (type == UNITTEST_ERROR_ROW) {
            row_node = (gnode_literal_expr_t *)parse_literal_expression(parser);
            if (row_node == NULL) goto handle_error;
        }
        else if (type == UNITTEST_ERROR_COL) {
            col_node = (gnode_literal_expr_t *)parse_literal_expression(parser);
            if (col_node == NULL) goto handle_error;
        }
        else if (type == UNITTEST_RESULT) {
            gtoken_t op = TOK_EOF;
            gtoken_t peek = gravity_lexer_peek(lexer);

            // check if peek is a + or - sign
            if ((peek == TOK_OP_SUB) || (peek == TOK_OP_ADD))
                op = gravity_lexer_next(lexer);
            else if (peek == TOK_KEY_NULL) {
                // an expected return value can now be keyword NULL
                gravity_lexer_next(lexer); // consume NULL keyword
                value_node = NULL;
                goto handle_continue;
            }

            value_node = (gnode_literal_expr_t *)parse_literal_expression(parser);
            if (value_node == NULL) goto handle_error;

            // if a negative sign has been parsed then manually fix the literal expression (if it is a number)
            if (op == TOK_OP_SUB) {
                if (value_node->type == LITERAL_INT) value_node->value.n64 = -value_node->value.n64;
                else if (value_node->type == LITERAL_FLOAT) value_node->value.d = -value_node->value.d;
            }
        }
        else {
            REPORT_ERROR(gravity_lexer_token(lexer), "Unknown token found in #unittest declaration.");
            goto handle_error;
        }

    handle_continue:
        parse_semicolon(parser);
    }

    parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);
    parse_semicolon(parser);

    // decode unit array and report error/unittest
    // unit test name max length is 1024
    const char *description = NULL;
    const char *note = NULL;
    char buffer[1024];
    char buffer2[1024];
    error_type_t expected_error = GRAVITY_ERROR_NONE;
    gravity_value_t expected_value = VALUE_FROM_NULL;
    int32_t expected_nrow = -1;
    int32_t expected_ncol = -1;

    // unittest name should be a literal string
    if ((name_node) && (name_node->type == LITERAL_STRING)) {
        // no more C strings in AST so we need a static buffer
        snprintf(buffer, sizeof(buffer), "%.*s", name_node->len, name_node->value.str);
        description = buffer;
    }

    // note (optional) should be a literal string
    if ((note_node) && (note_node->type == LITERAL_STRING)) {
        // no more C strings in AST so we need a static buffer
        snprintf(buffer2, sizeof(buffer2), "%.*s", note_node->len, note_node->value.str);
        note = buffer2;
    }

    // decode expected error: NONE, SYNTAX, SEMANTIC, RUNTIME, WARNING
    if (err_node) {
        if (string_cmp(err_node->value, "NONE") == 0)
            expected_error = GRAVITY_ERROR_NONE;
        else if (string_cmp(err_node->value, "SYNTAX") == 0)
            expected_error = GRAVITY_ERROR_SYNTAX;
        else if (string_cmp(err_node->value, "SEMANTIC") == 0)
            expected_error = GRAVITY_ERROR_SEMANTIC;
        else if (string_cmp(err_node->value, "RUNTIME") == 0)
            expected_error = GRAVITY_ERROR_RUNTIME;
        else if (string_cmp(err_node->value, "WARNING") == 0)
            expected_error = GRAVITY_WARNING;
    }

    // decode error line/col
    if ((row_node) && (row_node->type == LITERAL_INT)) {
        expected_nrow = (int32_t)row_node->value.n64;
    }
    if ((col_node) && (col_node->type == LITERAL_INT)) {
        expected_ncol = (int32_t)col_node->value.n64;
    }

    // decode unittest expected result
    if (value_node) {
        if (value_node->type == LITERAL_STRING)
            expected_value = VALUE_FROM_CSTRING(NULL, value_node->value.str);
        else if (value_node->type == LITERAL_INT)
            expected_value = VALUE_FROM_INT((gravity_int_t)value_node->value.n64);
        else if (value_node->type == LITERAL_FLOAT)
            expected_value = VALUE_FROM_FLOAT((gravity_float_t)value_node->value.d);
        else if (value_node->type == LITERAL_BOOL)
            expected_value = (value_node->value.n64) ? VALUE_FROM_TRUE : VALUE_FROM_FALSE;
    }

    // report unittest to delegate
    if ((parser->delegate) && (parser->delegate->unittest_callback)) {
        gravity_unittest_callback unittest_cb = parser->delegate->unittest_callback;
        unittest_cb(NULL, expected_error, description, note, expected_value, expected_nrow, expected_ncol, parser->delegate->xdata);
    } else {
        // it was unit test responsability to free expected_value but if no unit test delegate is set I should take care of it
        gravity_value_free(NULL, expected_value);
    }

    // free temp nodes
    if (name_node) gnode_free((gnode_t*)name_node);
    if (note_node) gnode_free((gnode_t*)note_node);
    if (err_node) gnode_free((gnode_t*)err_node);
    if (row_node) gnode_free((gnode_t*)row_node);
    if (col_node) gnode_free((gnode_t*)col_node);
    if (value_node) gnode_free((gnode_t*)value_node);

    // always return NULL
    return NULL;

handle_error:
    parse_skip_until(parser, TOK_OP_CLOSED_CURLYBRACE);
    return NULL;
}